

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::HttpSocket::_HandleStatus(HttpSocket *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  bool local_7b;
  bool local_7a;
  bool local_79;
  byte local_6d;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *loc;
  bool forceGET;
  char *pcStack_28;
  bool success;
  char *conn;
  char *encoding;
  HttpSocket *this_local;
  
  encoding = (char *)this;
  pcVar4 = Hdr(this,"content-length");
  uVar2 = safeatoi(pcVar4);
  this->_contentLen = uVar2;
  this->_remaining = uVar2;
  conn = Hdr(this,"transfer-encoding");
  local_6d = 0;
  if (conn != (char *)0x0) {
    iVar3 = strncasecmp(conn,"chunked",7);
    local_6d = iVar3 != 0 ^ 0xff;
  }
  this->_chunkedTransfer = (bool)(local_6d & 1);
  pcStack_28 = Hdr(this,"connection");
  local_79 = true;
  if (pcStack_28 != (char *)0x0) {
    iVar3 = strncasecmp(pcStack_28,"keep-alive",10);
    local_79 = iVar3 != 0;
  }
  this->_mustClose = local_79;
  bVar1 = IsSuccess(this);
  local_7a = true;
  if (!bVar1) {
    local_7b = false;
    if (99 < this->_status) {
      local_7b = this->_status < 200;
    }
    local_7a = local_7b;
  }
  loc._7_1_ = local_7a;
  if (local_7a == false) {
    loc._6_1_ = 0;
    uVar2 = this->_status;
    if (1 < uVar2 - 0x12d) {
      if (uVar2 == 0x12f) {
        loc._6_1_ = 1;
      }
      else if (1 < uVar2 - 0x133) {
        return false;
      }
    }
    if (((this->_followRedir & 1U) != 0) && (pcVar4 = Hdr(this,"location"), pcVar4 != (char *)0x0))
    {
      local_38 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar4,&local_59);
      _Redirect(this,&local_58,(bool)(loc._6_1_ & 1));
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool HttpSocket::_HandleStatus()
{
    _remaining = _contentLen = safeatoi(Hdr("content-length"));

    const char *encoding = Hdr("transfer-encoding");
    _chunkedTransfer = encoding && !STRNICMP(encoding, "chunked", 7);

    const char *conn = Hdr("connection"); // if its not keep-alive, server will close it, so we can too
    _mustClose = !conn || STRNICMP(conn, "keep-alive", 10);

    // As per the spec, we also need to handle 1xx codes, but are free to ignore them
    const bool success = IsSuccess() || (_status >= 100 && _status <= 199);

    if(!(_chunkedTransfer || _contentLen) && success)
        traceprint("_ParseHeader: Not chunked transfer and content-length==0, this will go fail\n");

    traceprint("Got HTTP Status %d\n", _status);

    if(success)
        return true;

    bool forceGET = false;
    switch(_status)
    {
        case 303:
            forceGET = true; // As per spec, continue with a GET request
        case 301:
        case 302:
        case 307:
        case 308:
            if(_followRedir)
                if(const char *loc = Hdr("location"))
                    _Redirect(loc, forceGET);
            return false;

        default:
            return false;
    }
}